

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeDensity.cpp
# Opt level: O0

void __thiscall OpenMD::PipeDensity::process(PipeDensity *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  SnapshotManager *this_00;
  Snapshot *pSVar11;
  reference pvVar12;
  double *pdVar13;
  StuntDouble *pSVar14;
  reference pvVar15;
  reference ppSVar16;
  reference this_01;
  reference pvVar17;
  long *in_RDI;
  RealType RVar18;
  uint k;
  RealType totalMass;
  uint j_1;
  uint i_1;
  int binNo2;
  int binNo1;
  Vector3d pos_1;
  Vector3d pos;
  RealType halfBox2_;
  RealType halfBox1_;
  Mat3x3d hmat;
  RealType sliceVolume;
  uint j;
  uint i;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int ii;
  StuntDouble *sd;
  Snapshot *in_stack_ffffffffffffebd8;
  DumpReader *in_stack_ffffffffffffebe0;
  StuntDouble *in_stack_ffffffffffffebe8;
  SelectionManager *in_stack_ffffffffffffebf0;
  SelectionEvaluator *in_stack_ffffffffffffec18;
  Snapshot *in_stack_ffffffffffffec60;
  int in_stack_ffffffffffffec6c;
  DumpReader *in_stack_ffffffffffffec70;
  uint local_1354;
  double local_1350;
  uint local_1348;
  uint local_1344;
  Vector<double,_3U> local_1338 [3];
  double local_12f0;
  double local_12e8;
  RectMatrix<double,_3U,_3U> local_12e0;
  double local_1298;
  uint local_1290;
  uint local_128c;
  int local_1288;
  int local_1274;
  string *in_stack_ffffffffffffee30;
  SimInfo *in_stack_ffffffffffffee38;
  DumpReader *in_stack_ffffffffffffee40;
  SelectionManager *local_10;
  
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar9 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x198060);
  DumpReader::DumpReader
            (in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,in_stack_ffffffffffffee30);
  local_1274 = DumpReader::getNFrames(in_stack_ffffffffffffebe0);
  *(int *)(in_RDI + 0x1a) = local_1274 / (int)in_RDI[6];
  for (local_1288 = 0; local_1288 < local_1274; local_1288 = (int)in_RDI[6] + local_1288) {
    DumpReader::readFrame(in_stack_ffffffffffffec70,in_stack_ffffffffffffec6c);
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar11 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI[0x19] = (long)pSVar11;
    for (local_128c = 0; local_128c < *(uint *)(in_RDI + 0xe2); local_128c = local_128c + 1) {
      for (local_1290 = 0; local_1290 < *(uint *)((long)in_RDI + 0x34); local_1290 = local_1290 + 1)
      {
        pvVar12 = std::
                  vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                                *)(in_RDI + 0xec),(ulong)local_128c);
        std::
        vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
        ::operator[](pvVar12,(ulong)local_1290);
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::clear
                  ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1981cc
                  );
      }
    }
    RVar18 = Snapshot::getVolume((Snapshot *)in_stack_ffffffffffffebe0);
    local_1298 = RVar18 / (double)(uint)((int)in_RDI[0xe2] * *(int *)((long)in_RDI + 0x34));
    Snapshot::getHmat(in_stack_ffffffffffffebd8);
    pdVar13 = RectMatrix<double,_3U,_3U>::operator()
                        (&local_12e0,*(uint *)(in_RDI + 0xeb),*(uint *)(in_RDI + 0xeb));
    local_12e8 = *pdVar13 * 0.5;
    in_stack_ffffffffffffec70 =
         (DumpReader *)
         RectMatrix<double,_3U,_3U>::operator()
                   (&local_12e0,*(uint *)((long)in_RDI + 0x75c),*(uint *)((long)in_RDI + 0x75c));
    local_12f0 = (double)in_stack_ffffffffffffec70->info_ * 0.5;
    bVar10 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
    in_stack_ffffffffffffec6c = CONCAT13(bVar10,(int3)in_stack_ffffffffffffec6c);
    if (bVar10) {
      in_stack_ffffffffffffec60 = (Snapshot *)(in_RDI + 0xc9);
      SelectionEvaluator::evaluate(in_stack_ffffffffffffec18);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffebf0,(SelectionSet *)in_stack_ffffffffffffebe8);
      SelectionSet::~SelectionSet((SelectionSet *)0x198384);
    }
    pSVar14 = SelectionManager::beginSelected
                        (in_stack_ffffffffffffebf0,(int *)in_stack_ffffffffffffebe8);
    local_10 = (SelectionManager *)pSVar14;
    while (local_10 != (SelectionManager *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffebe8);
      if (bVar9) {
        Snapshot::wrapVector(in_stack_ffffffffffffec60,(Vector3d *)pSVar14);
      }
      StuntDouble::setPos((StuntDouble *)in_stack_ffffffffffffebf0,
                          (Vector3d *)in_stack_ffffffffffffebe8);
      local_10 = (SelectionManager *)
                 SelectionManager::nextSelected
                           (in_stack_ffffffffffffebf0,(int *)in_stack_ffffffffffffebe8);
    }
    local_10 = (SelectionManager *)
               SelectionManager::beginSelected
                         (in_stack_ffffffffffffebf0,(int *)in_stack_ffffffffffffebe8);
    while (local_10 != (SelectionManager *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffebe8);
      dVar8 = local_12e8;
      uVar5 = *(uint *)(in_RDI + 0xe2);
      pdVar13 = Vector<double,_3U>::operator[](local_1338,*(uint *)(in_RDI + 0xeb));
      dVar1 = *pdVar13;
      pdVar13 = RectMatrix<double,_3U,_3U>::operator()
                          (&local_12e0,*(uint *)(in_RDI + 0xeb),*(uint *)(in_RDI + 0xeb));
      dVar7 = local_12f0;
      dVar2 = *pdVar13;
      uVar6 = *(uint *)((long)in_RDI + 0x34);
      in_stack_ffffffffffffec18 =
           (SelectionEvaluator *)
           Vector<double,_3U>::operator[](local_1338,*(uint *)((long)in_RDI + 0x75c));
      dVar3 = *(double *)&(in_stack_ffffffffffffec18->compiler).filename;
      pdVar13 = RectMatrix<double,_3U,_3U>::operator()
                          (&local_12e0,*(uint *)((long)in_RDI + 0x75c),
                           *(uint *)((long)in_RDI + 0x75c));
      dVar4 = *pdVar13;
      pvVar12 = std::
                vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                              *)(in_RDI + 0xec),
                             (long)(int)(((double)uVar5 * (dVar8 + dVar1)) / dVar2));
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::operator[](pvVar12,(long)(int)(((double)uVar6 * (dVar7 + dVar3)) / dVar4));
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                 in_stack_ffffffffffffebf0,(value_type *)in_stack_ffffffffffffebe8);
      in_stack_ffffffffffffebf0 =
           (SelectionManager *)
           SelectionManager::nextSelected
                     (in_stack_ffffffffffffebf0,(int *)in_stack_ffffffffffffebe8);
      local_10 = in_stack_ffffffffffffebf0;
    }
    for (local_1344 = 0; local_1344 < *(uint *)(in_RDI + 0xe2); local_1344 = local_1344 + 1) {
      for (local_1348 = 0; local_1348 < *(uint *)((long)in_RDI + 0x34); local_1348 = local_1348 + 1)
      {
        local_1350 = 0.0;
        local_1354 = 0;
        while( true ) {
          in_stack_ffffffffffffebe8 = (StuntDouble *)(ulong)local_1354;
          pvVar12 = std::
                    vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                                  *)(in_RDI + 0xec),(ulong)local_1344);
          pvVar15 = std::
                    vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    ::operator[](pvVar12,(ulong)local_1348);
          pSVar14 = (StuntDouble *)
                    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                              (pvVar15);
          if (pSVar14 <= in_stack_ffffffffffffebe8) break;
          pvVar12 = std::
                    vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                                  *)(in_RDI + 0xec),(ulong)local_1344);
          pvVar15 = std::
                    vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    ::operator[](pvVar12,(ulong)local_1348);
          ppSVar16 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                     operator[](pvVar15,(ulong)local_1354);
          in_stack_ffffffffffffebe0 = (DumpReader *)StuntDouble::getMass(*ppSVar16);
          local_1350 = (double)in_stack_ffffffffffffebe0 + local_1350;
          local_1354 = local_1354 + 1;
        }
        in_stack_ffffffffffffebd8 = (Snapshot *)(local_1350 / local_1298);
        this_01 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)(in_RDI + 0xef),(ulong)local_1344);
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            (this_01,(ulong)local_1348);
        *pvVar17 = (double)in_stack_ffffffffffffebd8 + *pvVar17;
      }
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x198868);
  }
  (**(code **)(*in_RDI + 0x20))();
  DumpReader::~DumpReader(in_stack_ffffffffffffebe0);
  return;
}

Assistant:

void PipeDensity::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          sliceSDLists_[i][j].clear();
        }
      }

      RealType sliceVolume = currentSnapshot_->getVolume() / (nBins2_ * nBins_);
      Mat3x3d hmat         = currentSnapshot_->getHmat();

      RealType halfBox1_ = hmat(axis1_, axis1_) / 2.0;
      RealType halfBox2_ = hmat(axis2_, axis2_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo1 =
            int(nBins2_ * (halfBox1_ + pos[axis1_]) / hmat(axis1_, axis1_));
        int binNo2 =
            int(nBins_ * (halfBox2_ + pos[axis2_]) / hmat(axis2_, axis2_));
        sliceSDLists_[binNo1][binNo2].push_back(sd);
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          RealType totalMass = 0;
          for (unsigned int k = 0; k < sliceSDLists_[i][j].size(); ++k) {
            totalMass += sliceSDLists_[i][j][k]->getMass();
          }
          density_[i][j] += totalMass / sliceVolume;
        }
      }
    }

    writeDensity();
  }